

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-utils.h
# Opt level: O0

_Bool plutovg_parse_number(char **begin,char *end,float *number)

{
  bool bVar1;
  char *pcVar2;
  float fVar3;
  bool local_4f;
  float local_48;
  int local_44;
  float divisor;
  int expsign;
  int sign;
  float exponent;
  float fraction;
  float integer;
  char *it;
  float *number_local;
  char *end_local;
  char **begin_local;
  
  _fraction = *begin;
  exponent = 0.0;
  sign = 0;
  expsign = 0;
  divisor = 1.4013e-45;
  local_44 = 1;
  if ((_fraction < end) && (*_fraction == '+')) {
    _fraction = _fraction + 1;
  }
  else if ((_fraction < end) && (*_fraction == '-')) {
    _fraction = _fraction + 1;
    divisor = -NAN;
  }
  if ((_fraction < end) && ((*_fraction == '.' || (('/' < *_fraction && (*_fraction < ':')))))) {
    if (('/' < *_fraction) && (*_fraction < ':')) {
      do {
        pcVar2 = _fraction + 1;
        exponent = exponent * 10.0 + (float)(*_fraction + -0x30);
        bVar1 = false;
        if ((pcVar2 < end) && (bVar1 = false, '/' < *pcVar2)) {
          bVar1 = *pcVar2 < ':';
        }
        _fraction = pcVar2;
      } while (bVar1);
    }
    if ((_fraction < end) && (*_fraction == '.')) {
      _fraction = _fraction + 1;
      if ((end <= _fraction) || ((*_fraction < '0' || ('9' < *_fraction)))) {
        return false;
      }
      local_48 = 1.0;
      do {
        pcVar2 = _fraction + 1;
        sign = (int)((float)sign * 10.0 + (float)(*_fraction + -0x30));
        local_48 = local_48 * 10.0;
        bVar1 = false;
        if ((pcVar2 < end) && (bVar1 = false, '/' < *pcVar2)) {
          bVar1 = *pcVar2 < ':';
        }
        _fraction = pcVar2;
      } while (bVar1);
      sign = (int)((float)sign / local_48);
    }
    if ((_fraction < end) && ((*_fraction == 'e' || (*_fraction == 'E')))) {
      pcVar2 = _fraction + 1;
      if ((pcVar2 < end) && (*pcVar2 == '+')) {
        pcVar2 = _fraction + 2;
      }
      else if ((pcVar2 < end) && (*pcVar2 == '-')) {
        local_44 = -1;
        pcVar2 = _fraction + 2;
      }
      _fraction = pcVar2;
      if (((end <= _fraction) || (*_fraction < '0')) || ('9' < *_fraction)) {
        return false;
      }
      do {
        pcVar2 = _fraction + 1;
        expsign = (int)((float)expsign * 10.0 + (float)(*_fraction + -0x30));
        bVar1 = false;
        if ((pcVar2 < end) && (bVar1 = false, '/' < *pcVar2)) {
          bVar1 = *pcVar2 < ':';
        }
        _fraction = pcVar2;
      } while (bVar1);
    }
    *begin = _fraction;
    *number = (float)(int)divisor * (exponent + (float)sign);
    if (((float)expsign != 0.0) || (NAN((float)expsign))) {
      fVar3 = powf(10.0,(float)local_44 * (float)expsign);
      *number = fVar3 * *number;
    }
    local_4f = false;
    if (-3.4028235e+38 <= *number) {
      local_4f = *number <= 3.4028235e+38;
    }
    begin_local._7_1_ = local_4f;
  }
  else {
    begin_local._7_1_ = false;
  }
  return begin_local._7_1_;
}

Assistant:

static inline bool plutovg_parse_number(const char** begin, const char* end, float* number)
{
    const char* it = *begin;
    float integer = 0;
    float fraction = 0;
    float exponent = 0;
    int sign = 1;
    int expsign = 1;

    if(it < end && *it == '+') {
        ++it;
    } else if(it < end && *it == '-') {
        ++it;
        sign = -1;
    }

    if(it >= end || (*it != '.' && !PLUTOVG_IS_NUM(*it)))
        return false;
    if(PLUTOVG_IS_NUM(*it)) {
        do {
            integer = 10.f * integer + (*it++ - '0');
        } while(it < end && PLUTOVG_IS_NUM(*it));
    }

    if(it < end && *it == '.') {
        ++it;
        if(it >= end || !PLUTOVG_IS_NUM(*it))
            return false;
        float divisor = 1.f;
        do {
            fraction = 10.f * fraction + (*it++ - '0');
            divisor *= 10.f;
        } while(it < end && PLUTOVG_IS_NUM(*it));
        fraction /= divisor;
    }

    if(it < end && (*it == 'e' || *it == 'E')) {
        ++it;
        if(it < end && *it == '+') {
            ++it;
        } else if(it < end && *it == '-') {
            ++it;
            expsign = -1;
        }

        if(it >= end || !PLUTOVG_IS_NUM(*it))
            return false;
        do {
            exponent = 10 * exponent + (*it++ - '0');
        } while(it < end && PLUTOVG_IS_NUM(*it));
    }

    *begin = it;
    *number = sign * (integer + fraction);
    if(exponent)
        *number *= powf(10.f, expsign * exponent);
    return *number >= -FLT_MAX && *number <= FLT_MAX;
}